

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

size_t kj::anon_unknown_36::WebSocketImpl::Header::headerSize(byte *bytes,size_t sizeSoFar)

{
  byte *pbStack_28;
  byte payloadLen;
  size_t required;
  size_t sizeSoFar_local;
  byte *bytes_local;
  
  if (sizeSoFar < 2) {
    bytes_local = (byte *)0x2;
  }
  else {
    pbStack_28 = (byte *)0x2;
    if ((bytes[1] & 0x80) != 0) {
      pbStack_28 = (byte *)0x6;
    }
    if ((bytes[1] & 0x7f) == 0x7f) {
      pbStack_28 = pbStack_28 + 8;
    }
    else if ((bytes[1] & 0x7f) == 0x7e) {
      pbStack_28 = pbStack_28 + 2;
    }
    bytes_local = pbStack_28;
  }
  return (size_t)bytes_local;
}

Assistant:

static size_t headerSize(byte const* bytes, size_t sizeSoFar) {
      if (sizeSoFar < 2) return 2;

      size_t required = 2;

      if (bytes[1] & USE_MASK_MASK) {
        required += 4;
      }

      byte payloadLen = bytes[1] & PAYLOAD_LEN_MASK;
      if (payloadLen == 127) {
        required += 8;
      } else if (payloadLen == 126) {
        required += 2;
      }

      return required;
    }